

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBrTableExpr
          (BinaryReaderInterp *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  Index index;
  State *pSVar1;
  Index depth;
  Result RVar2;
  Enum EVar3;
  ulong uVar4;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Location loc;
  Location loc_2;
  u32 local_140;
  u32 local_13c;
  u32 local_138;
  Index local_134;
  string_view *local_130;
  SharedValidator *local_128;
  ulong local_120;
  TypeChecker *local_118;
  Index *local_110;
  Location local_108;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  local_128 = &this->validator_;
  local_108.field_1.field_0.last_column = 0;
  local_108.filename._M_len = (this->filename_)._M_len;
  local_108.filename._M_str = (this->filename_)._M_str;
  local_108.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_110 = target_depths;
  RVar2 = SharedValidator::BeginBrTable(local_128,&local_108);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_130 = &this->filename_;
    local_134 = default_target_depth;
    Istream::Emit(this->istream_,BrTable,num_targets);
    if (num_targets != 0) {
      local_118 = &(this->validator_).typechecker_;
      uVar4 = 0;
      local_120 = (ulong)num_targets;
      do {
        index = local_110[uVar4];
        local_108.field_1.field_0.last_column = 0;
        local_108.filename._M_len = local_130->_M_len;
        local_108.filename._M_str = local_130->_M_str;
        pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
        local_108.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
        local_e8.field_1.field_0.last_column = 0;
        local_e8.filename._M_len = local_130->_M_len;
        local_e8.filename._M_str = local_130->_M_str;
        local_e8.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
        Var::Var(&local_78,index,&local_e8);
        RVar2 = SharedValidator::OnBrTableTarget(local_128,&local_108,&local_78);
        Var::~Var(&local_78);
        if (RVar2.enum_ == Error) {
          return (Result)Error;
        }
        RVar2 = GetBrDropKeepCount(this,index,&local_138,&local_13c);
        if (RVar2.enum_ == Error) {
          return (Result)Error;
        }
        RVar2 = TypeChecker::GetCatchCount(local_118,index,&local_140);
        if (RVar2.enum_ == Error) {
          return (Result)Error;
        }
        Istream::Emit(this->istream_,InterpDropKeep,local_138,local_13c);
        Istream::Emit(this->istream_,InterpCatchDrop,local_140);
        EmitBr(this,index,0,0,0);
        uVar4 = uVar4 + 1;
      } while (local_120 != uVar4);
    }
    depth = local_134;
    local_108.field_1.field_0.last_column = 0;
    local_108.filename._M_len = local_130->_M_len;
    local_108.filename._M_str = local_130->_M_str;
    pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
    local_108.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
    local_e8.field_1.field_0.last_column = 0;
    local_e8.filename._M_len = local_130->_M_len;
    local_e8.filename._M_str = local_130->_M_str;
    local_e8.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
    Var::Var(&local_c0,local_134,&local_e8);
    RVar2 = SharedValidator::OnBrTableTarget(local_128,&local_108,&local_c0);
    Var::~Var(&local_c0);
    EVar3 = Error;
    if (((RVar2.enum_ != Error) &&
        (RVar2 = GetBrDropKeepCount(this,depth,&local_138,&local_13c), RVar2.enum_ != Error)) &&
       (RVar2 = TypeChecker::GetCatchCount(&(this->validator_).typechecker_,depth,&local_140),
       RVar2.enum_ != Error)) {
      Istream::EmitDropKeep(this->istream_,local_138,local_13c);
      Istream::Emit(this->istream_,InterpCatchDrop,local_140);
      EmitBr(this,local_134,0,0,0);
      local_108.field_1.field_0.last_column = 0;
      local_108.filename._M_len = local_130->_M_len;
      local_108.filename._M_str = local_130->_M_str;
      local_108.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      RVar2 = SharedValidator::EndBrTable(local_128,&local_108);
      EVar3 = (Enum)(RVar2.enum_ == Error);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnBrTableExpr(Index num_targets,
                                         Index* target_depths,
                                         Index default_target_depth) {
  CHECK_RESULT(validator_.BeginBrTable(GetLocation()));
  Index drop_count, keep_count, catch_drop_count;
  istream_.Emit(Opcode::BrTable, num_targets);

  for (Index i = 0; i < num_targets; ++i) {
    Index depth = target_depths[i];
    CHECK_RESULT(
        validator_.OnBrTableTarget(GetLocation(), Var(depth, GetLocation())));
    CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
    CHECK_RESULT(validator_.GetCatchCount(depth, &catch_drop_count));
    // Emit DropKeep directly (instead of using EmitDropKeep) so the
    // instruction has a fixed size. Same for CatchDrop as well.
    istream_.Emit(Opcode::InterpDropKeep, drop_count, keep_count);
    istream_.Emit(Opcode::InterpCatchDrop, catch_drop_count);
    EmitBr(depth, 0, 0, 0);
  }
  CHECK_RESULT(validator_.OnBrTableTarget(
      GetLocation(), Var(default_target_depth, GetLocation())));
  CHECK_RESULT(
      GetBrDropKeepCount(default_target_depth, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(default_target_depth, &catch_drop_count));
  // The default case doesn't need a fixed size, since it is never jumped over.
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::InterpCatchDrop, catch_drop_count);
  EmitBr(default_target_depth, 0, 0, 0);

  CHECK_RESULT(validator_.EndBrTable(GetLocation()));
  return Result::Ok;
}